

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::EntryPointPolymorphicInlineCacheInfo::EntryPointPolymorphicInlineCacheInfo
          (EntryPointPolymorphicInlineCacheInfo *this,FunctionBody *functionBody)

{
  Recycler *allocator;
  FunctionBody *functionBody_local;
  EntryPointPolymorphicInlineCacheInfo *this_local;
  
  PolymorphicInlineCacheInfo::PolymorphicInlineCacheInfo(&this->selfInfo,functionBody);
  allocator = FunctionProxy::GetRecycler((FunctionProxy *)functionBody);
  SListCounted<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler>::SListCounted
            (&this->inlineeInfo,allocator);
  return;
}

Assistant:

EntryPointPolymorphicInlineCacheInfo::EntryPointPolymorphicInlineCacheInfo(FunctionBody * functionBody) :
        selfInfo(functionBody),
        inlineeInfo(functionBody->GetRecycler())
    {
    }